

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int nc_email(ASN1_IA5STRING *eml,ASN1_IA5STRING *base)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *data;
  undefined1 local_60 [4];
  int base_has_at;
  CBS base_local;
  CBS eml_local;
  CBS base_cbs;
  CBS eml_cbs;
  ASN1_IA5STRING *base_local_1;
  ASN1_IA5STRING *eml_local_1;
  
  CBS_init((CBS *)&base_cbs.len,eml->data,(long)eml->length);
  CBS_init((CBS *)&eml_local.len,base->data,(long)base->length);
  iVar1 = CBS_get_until_first((CBS *)&base_cbs.len,(CBS *)&base_local.len,'@');
  if (iVar1 == 0) {
    eml_local_1._4_4_ = 0x35;
  }
  else {
    iVar1 = CBS_get_until_first((CBS *)&eml_local.len,(CBS *)local_60,'@');
    if ((iVar1 == 0) && (iVar2 = starts_with((CBS *)&eml_local.len,'.'), iVar2 != 0)) {
      iVar1 = has_suffix_case((CBS *)&base_cbs.len,(CBS *)&eml_local.len);
      if (iVar1 == 0) {
        eml_local_1._4_4_ = 0x2f;
      }
      else {
        eml_local_1._4_4_ = 0;
      }
    }
    else {
      if (iVar1 != 0) {
        sVar3 = CBS_len((CBS *)local_60);
        if (sVar3 != 0) {
          data = CBS_data((CBS *)&base_local.len);
          sVar3 = CBS_len((CBS *)&base_local.len);
          iVar1 = CBS_mem_equal((CBS *)local_60,data,sVar3);
          if (iVar1 == 0) {
            return 0x2f;
          }
        }
        iVar1 = starts_with((CBS *)&eml_local.len,'@');
        if (iVar1 == 0) {
          __assert_fail("starts_with(&base_cbs, \'@\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                        ,0x1ca,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
        }
        CBS_skip((CBS *)&eml_local.len,1);
      }
      iVar1 = starts_with((CBS *)&base_cbs.len,'@');
      if (iVar1 == 0) {
        __assert_fail("starts_with(&eml_cbs, \'@\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                      ,0x1cf,"int nc_email(const ASN1_IA5STRING *, const ASN1_IA5STRING *)");
      }
      CBS_skip((CBS *)&base_cbs.len,1);
      iVar1 = equal_case((CBS *)&eml_local.len,(CBS *)&base_cbs.len);
      if (iVar1 == 0) {
        eml_local_1._4_4_ = 0x2f;
      }
      else {
        eml_local_1._4_4_ = 0;
      }
    }
  }
  return eml_local_1._4_4_;
}

Assistant:

static int nc_email(const ASN1_IA5STRING *eml, const ASN1_IA5STRING *base) {
  CBS eml_cbs, base_cbs;
  CBS_init(&eml_cbs, eml->data, eml->length);
  CBS_init(&base_cbs, base->data, base->length);

  // TODO(davidben): In OpenSSL 1.1.1, this switched from the first '@' to the
  // last one. Match them here, or perhaps do an actual parse. Looks like
  // multiple '@'s may be allowed in quoted strings.
  CBS eml_local, base_local;
  if (!CBS_get_until_first(&eml_cbs, &eml_local, '@')) {
    return X509_V_ERR_UNSUPPORTED_NAME_SYNTAX;
  }
  int base_has_at = CBS_get_until_first(&base_cbs, &base_local, '@');

  // Special case: initial '.' is RHS match
  if (!base_has_at && starts_with(&base_cbs, '.')) {
    if (has_suffix_case(&eml_cbs, &base_cbs)) {
      return X509_V_OK;
    }
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  // If we have anything before '@' match local part
  if (base_has_at) {
    // TODO(davidben): This interprets a constraint of "@example.com" as
    // "example.com", which is not part of RFC5280.
    if (CBS_len(&base_local) > 0) {
      // Case sensitive match of local part
      if (!CBS_mem_equal(&base_local, CBS_data(&eml_local),
                         CBS_len(&eml_local))) {
        return X509_V_ERR_PERMITTED_VIOLATION;
      }
    }
    // Position base after '@'
    assert(starts_with(&base_cbs, '@'));
    CBS_skip(&base_cbs, 1);
  }

  // Just have hostname left to match: case insensitive
  assert(starts_with(&eml_cbs, '@'));
  CBS_skip(&eml_cbs, 1);
  if (!equal_case(&base_cbs, &eml_cbs)) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  return X509_V_OK;
}